

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_lzop.c
# Opt level: O1

int archive_write_lzop_options(archive_write_filter *f,char *key,char *value)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  
  puVar1 = (uint *)f->data;
  iVar2 = strcmp(key,"compression-level");
  iVar3 = -0x14;
  if ((((value != (char *)0x0) && (iVar2 == 0)) && ((byte)(*value - 0x31U) < 9)) &&
     (value[1] == '\0')) {
    *puVar1 = (uint)(byte)(*value - 0x30);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int
archive_write_lzop_options(struct archive_write_filter *f, const char *key,
    const char *value)
{
	struct write_lzop *data = (struct write_lzop *)f->data;

	if (strcmp(key, "compression-level") == 0) {
		if (value == NULL || !(value[0] >= '1' && value[0] <= '9') ||
		    value[1] != '\0')
			return (ARCHIVE_WARN);
		data->compression_level = value[0] - '0';
		return (ARCHIVE_OK);
	}
	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}